

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void lab6(Node *ast)

{
  Node NStack_48;
  
  Node::Node(&NStack_48,ast);
  printTree(&NStack_48,0);
  Node::~Node(&NStack_48);
  return;
}

Assistant:

void lab6(Node &ast) {
    printTree(ast, 0);
}